

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void mergesort_lcp_3way_parallel(uchar **strings,size_t n)

{
  MergeResult MVar1;
  ostream *poVar2;
  lcp_t *lcp_input_00;
  lcp_t *lcp_output;
  uchar **strings_output;
  MergeResult m;
  uchar **input_tmp;
  lcp_t *lcp_tmp;
  lcp_t *lcp_input;
  size_t n_local;
  uchar **strings_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"mergesort_lcp_3way_parallel");
  std::operator<<(poVar2,'\n');
  lcp_input_00 = (lcp_t *)malloc(n << 3);
  lcp_output = (lcp_t *)malloc(n << 3);
  strings_output = (uchar **)malloc(n << 3);
  MVar1 = mergesort_lcp_3way_parallel<false>(strings,strings_output,lcp_input_00,lcp_output,n);
  if (MVar1 == SortedInTemp) {
    memcpy(strings,strings_output,n << 3);
  }
  free(lcp_input_00);
  free(lcp_output);
  free(strings_output);
  return;
}

Assistant:

void
mergesort_lcp_3way_parallel(unsigned char** strings, size_t n)
{
	debug() << __func__ << '\n';
	lcp_t* lcp_input = (lcp_t*) malloc(n*sizeof(lcp_t));
	lcp_t* lcp_tmp   = (lcp_t*) malloc(n*sizeof(lcp_t));
	unsigned char** input_tmp = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
#pragma omp parallel
	{
#pragma omp single
		{
			const MergeResult m = mergesort_lcp_3way_parallel<false>(
					strings, input_tmp, lcp_input, lcp_tmp, n);
			if (m == SortedInTemp) {
				(void) memcpy(strings, input_tmp, n*sizeof(unsigned char*));
			}
		}
	}
	free(lcp_input);
	free(lcp_tmp);
	free(input_tmp);
}